

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

ushort __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::GetAddressIndex
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,void *objectAddress)

{
  char *pcVar1;
  code *pcVar2;
  bool bVar3;
  ushort uVar4;
  undefined4 *puVar5;
  
  pcVar1 = (this->super_HeapBlock).address;
  if (objectAddress < pcVar1 || pcVar1 + 0x1000 <= objectAddress) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x227,"(objectAddress >= address && objectAddress < this->GetEndAddress())",
                       "objectAddress >= address && objectAddress < this->GetEndAddress()");
    if (!bVar3) goto LAB_006af207;
    *puVar5 = 0;
  }
  if (((ulong)objectAddress & 0xf) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x228,"(HeapInfo::IsAlignedAddress(objectAddress))",
                       "HeapInfo::IsAlignedAddress(objectAddress)");
    if (!bVar3) goto LAB_006af207;
    *puVar5 = 0;
  }
  if (((ulong)(this->super_HeapBlock).address & 0xf) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x229,"(HeapInfo::IsAlignedAddress(address))",
                       "HeapInfo::IsAlignedAddress(address)");
    if (!bVar3) goto LAB_006af207;
    *puVar5 = 0;
  }
  uVar4 = ValidPointers<SmallAllocationBlockAttributes>::GetAddressIndex
                    (&this->validPointers,
                     (uint)((int)objectAddress - *(int *)&(this->super_HeapBlock).address) >> 4);
  if (0x100 < (ushort)(uVar4 + 1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x230,
                       "(index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit || index <= TBlockAttributes::MaxAddressBit)"
                       ,
                       "index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit || index <= TBlockAttributes::MaxAddressBit"
                      );
    if (!bVar3) {
LAB_006af207:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return uVar4;
}

Assistant:

ushort
SmallHeapBlockT<TBlockAttributes>::GetAddressIndex(void * objectAddress)
{
    Assert(objectAddress >= address && objectAddress < this->GetEndAddress());
    Assert(HeapInfo::IsAlignedAddress(objectAddress));
    Assert(HeapInfo::IsAlignedAddress(address));

    unsigned int offset = (unsigned int)((char*)objectAddress - address);
    offset = offset >> HeapConstants::ObjectAllocationShift;

    ushort index = validPointers.GetAddressIndex(offset);
    Assert(index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit ||
        index <= TBlockAttributes::MaxAddressBit);
    return index;
}